

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O1

LayoutBindingTestResult * __thiscall
glcts::LayoutBindingBaseCase::binding_array_implicit
          (LayoutBindingTestResult *__return_storage_ptr__,LayoutBindingBaseCase *this)

{
  String *pSVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined1 *puVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  LayoutBindingProgram *this_00;
  mapped_type_conflict *pmVar7;
  uint *puVar8;
  uint uVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  bool *pbVar11;
  int expected;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  bool bVar15;
  bool bVar16;
  bool local_4ca;
  String local_4c0;
  String local_4a0;
  allocator<char> local_47a;
  allocator<char> local_479;
  ulong local_478;
  LayoutBindingTestResult *local_470;
  StringVector list;
  long *local_438 [2];
  long local_428 [2];
  IProgramContextSupplier *local_418;
  code *local_410;
  uint *local_408;
  ulong local_400;
  ulong local_3f8;
  String local_3f0;
  long *local_3d0 [2];
  long local_3c0 [2];
  String local_3b0;
  String decl;
  vector<int,_std::allocator<int>_> bindings;
  String local_358;
  StringIntMap bindingPoints;
  ios_base local_2c8 [264];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c0;
  StringStream s;
  undefined4 extraout_var_01;
  
  iVar5 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x20])(this);
  makeSparseRange(&bindings,this,iVar5,0);
  local_4ca = true;
  bVar15 = bindings.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start <
           bindings.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  if (bVar15) {
    local_418 = &this->super_IProgramContextSupplier;
    pSVar1 = &__return_storage_ptr__->m_reason;
    local_410 = glUniformMatrix3x2fv;
    local_4ca = true;
    paVar2 = &(__return_storage_ptr__->m_reason).field_2;
    puVar8 = (uint *)bindings.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
    local_470 = __return_storage_ptr__;
    do {
      paVar10 = &local_4a0.field_2;
      uVar12 = *puVar8;
      local_408 = puVar8;
      iVar5 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x20])(this);
      uVar6 = iVar5 - uVar12;
      local_478 = CONCAT44(local_478._4_4_,uVar6);
      uVar13 = 4;
      if ((int)uVar6 < 4) {
        uVar13 = (ulong)uVar6;
      }
      iVar5 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])(this);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&s,*(char **)CONCAT44(extraout_var,iVar5),&local_479);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1a])
                ((String *)&bindingPoints,this,(ulong)uVar12);
      iVar5 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])(this);
      local_3f8 = (ulong)uVar12;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4a0,*(char **)(CONCAT44(extraout_var_00,iVar5) + 0x18),&local_47a)
      ;
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(&list,this,0);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1c])
                (&local_4c0,this,&list);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(local_3d0,this,0)
      ;
      local_438[0] = local_428;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"float","");
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1d])
                (&local_3b0,this,local_3d0,(string *)local_438);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])
                (&local_3f0,this,0);
      uVar12 = (uint)uVar13;
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1e])
                (&local_358,this,uVar13);
      buildUniformDecl(&decl,this,(String *)&s,(String *)&bindingPoints,&local_4a0,&local_4c0,
                       &local_3b0,&local_3f0,&local_358);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_358._M_dataplus._M_p != &local_358.field_2) {
        operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
        operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
        operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
      }
      if (local_438[0] != local_428) {
        operator_delete(local_438[0],local_428[0] + 1);
      }
      if (local_3d0[0] != local_3c0) {
        operator_delete(local_3d0[0],local_3c0[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
        operator_delete(local_4c0._M_dataplus._M_p,local_4c0.field_2._M_allocated_capacity + 1);
      }
      if (list.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pointer)&list.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        operator_delete(list.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (ulong)((long)&((list.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                       _M_dataplus)._M_p + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a0._M_dataplus._M_p != paVar10) {
        operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1);
      }
      if ((_Base_ptr *)bindingPoints._M_t._M_impl._0_8_ !=
          &bindingPoints._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
        operator_delete((void *)bindingPoints._M_t._M_impl._0_8_,
                        (ulong)((long)&(bindingPoints._M_t._M_impl.super__Rb_tree_header._M_header.
                                       _M_parent)->_M_color + 1));
      }
      if (s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
          _vptr_basic_ostream !=
          (_func_int **)
          &s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
        operator_delete(s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
                        _vptr_basic_ostream,
                        CONCAT71(s.super_ostringstream.
                                 super_basic_ostream<char,_std::char_traits<char>_>._17_7_,
                                 s.super_ostringstream.
                                 super_basic_ostream<char,_std::char_traits<char>_>._16_1_) + 1);
      }
      setTemplateParam(this,(this->m_stage).type,"UNIFORM_DECL",&decl);
      std::ios_base::ios_base
                ((ios_base *)
                 &s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
                  field_0x70);
      s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._112_8_ = local_410;
      s.super_ostringstream._328_8_ = 0;
      s.super_ostringstream._336_2_ = 0;
      s.super_ostringstream._360_8_ = 0;
      s.super_ostringstream._368_8_ = 0;
      s.super_ostringstream._344_8_ = 0;
      s.super_ostringstream._352_8_ = 0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
      s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
           (_func_int **)&PTR__StringStream_02138dd0;
      s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._112_8_ =
           &PTR__StringStream_02138df8;
      if (0 < (int)local_478) {
        uVar6 = 1;
        if (1 < (int)uVar12) {
          uVar6 = uVar12;
        }
        uVar14 = 0;
        do {
          iVar5 = (int)uVar14;
          pbVar11 = (bool *)0x1c21d5d;
          if (iVar5 == 0) {
            pbVar11 = fixed_sample_locations_values + 1;
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&s,pbVar11,(ulong)(iVar5 != 0) * 3);
          (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1f])
                    (&local_4a0,this,0,uVar14);
          (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1b])
                    (&bindingPoints,this,&local_4a0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&s,(char *)bindingPoints._M_t._M_impl._0_8_,
                     bindingPoints._M_t._M_impl.super__Rb_tree_header._M_header._0_8_);
          if ((_Base_ptr *)bindingPoints._M_t._M_impl._0_8_ !=
              &bindingPoints._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
            operator_delete((void *)bindingPoints._M_t._M_impl._0_8_,
                            (ulong)((long)&(bindingPoints._M_t._M_impl.super__Rb_tree_header.
                                            _M_header._M_parent)->_M_color + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4a0._M_dataplus._M_p != paVar10) {
            operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1);
          }
          uVar14 = (ulong)(iVar5 + 1U);
        } while (uVar6 != iVar5 + 1U);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&s,";\n",2);
      std::__cxx11::stringbuf::str();
      setTemplateParam(this,(this->m_stage).type,"UNIFORM_ACCESS",(String *)&bindingPoints);
      if ((_Base_ptr *)bindingPoints._M_t._M_impl._0_8_ !=
          &bindingPoints._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
        operator_delete((void *)bindingPoints._M_t._M_impl._0_8_,
                        (ulong)((long)&(bindingPoints._M_t._M_impl.super__Rb_tree_header._M_header.
                                       _M_parent)->_M_color + 1));
      }
      updateTemplate(this,(this->m_stage).type);
      iVar5 = (*local_418->_vptr_IProgramContextSupplier[6])();
      this_00 = (LayoutBindingProgram *)CONCAT44(extraout_var_01,iVar5);
      bVar4 = LayoutBindingProgram::compiledAndLinked(this_00);
      bVar16 = local_4ca != false;
      local_4ca = bVar16 && bVar4;
      if (bVar16 && bVar4) {
        list.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        list.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        list.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (0 < (int)local_478) {
          uVar6 = 1;
          if (1 < (int)uVar12) {
            uVar6 = uVar12;
          }
          uVar14 = 0;
          do {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&bindingPoints);
            (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])
                      (&local_4a0,this,0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&bindingPoints,local_4a0._M_dataplus._M_p,
                       local_4a0._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4a0._M_dataplus._M_p != paVar10) {
              operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1
                             );
            }
            (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])
                      (&local_4c0,this,0);
            (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1c])
                      (&local_4a0,this,&local_4c0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
              operator_delete(local_4c0._M_dataplus._M_p,local_4c0.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_4a0._M_string_length != 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&bindingPoints,"_block",6);
            }
            (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1e])
                      (&local_4c0,this,uVar14);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&bindingPoints,local_4c0._M_dataplus._M_p,
                       local_4c0._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
              operator_delete(local_4c0._M_dataplus._M_p,local_4c0.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::stringbuf::str();
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&list,
                       &local_4c0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
              operator_delete(local_4c0._M_dataplus._M_p,local_4c0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4a0._M_dataplus._M_p != paVar10) {
              operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&bindingPoints);
            std::ios_base::~ios_base(local_2c8);
            uVar9 = (int)uVar14 + 1;
            uVar14 = (ulong)uVar9;
          } while (uVar6 != uVar9);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_1c0,&list);
        (*this_00->_vptr_LayoutBindingProgram[3])(&bindingPoints,this_00,&local_1c0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_1c0);
        bVar4 = (int)local_478 < 1;
        if (0 < (int)local_478) {
          local_478 = uVar13;
          if ((int)uVar12 < 2) {
            local_478 = 1;
          }
          uVar14 = 0;
          iVar5 = 0;
          local_400 = uVar13;
          do {
            pmVar7 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     ::operator[](&bindingPoints,
                                  list.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + uVar14);
            expected = (int)local_3f8 + iVar5;
            local_4ca = (bool)(local_4ca & expected == *pmVar7);
            if (local_4ca == false) {
              local_4c0._M_dataplus._M_p = (pointer)&local_4c0.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_4c0,"binding point did not match default","");
              pmVar7 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                       ::operator[](&bindingPoints,
                                    list.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + uVar14);
              generateLog<int,int>(&local_4a0,this,&local_4c0,*pmVar7,expected);
              local_470->m_passed = false;
              local_470->m_notRunForThisContext = false;
              (local_470->m_reason)._M_dataplus._M_p = (pointer)paVar2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)pSVar1,local_4a0._M_dataplus._M_p,
                         local_4a0._M_dataplus._M_p + local_4a0._M_string_length);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
                operator_delete(local_4a0._M_dataplus._M_p,
                                local_4a0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
                operator_delete(local_4c0._M_dataplus._M_p,
                                local_4c0.field_2._M_allocated_capacity + 1);
              }
              break;
            }
            uVar14 = uVar14 + 1;
            iVar5 = iVar5 + 1;
            bVar4 = local_400 <= uVar14;
          } while (uVar14 != local_478);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
        ::~_Rb_tree(&bindingPoints._M_t);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&list);
      }
      else {
        LayoutBindingProgram::getErrorLog_abi_cxx11_((String *)&bindingPoints,this_00,false);
        local_470->m_passed = false;
        local_470->m_notRunForThisContext = false;
        (local_470->m_reason)._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)pSVar1,bindingPoints._M_t._M_impl._0_8_,
                   bindingPoints._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ +
                   bindingPoints._M_t._M_impl._0_8_);
        if ((_Base_ptr *)bindingPoints._M_t._M_impl._0_8_ !=
            &bindingPoints._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
          operator_delete((void *)bindingPoints._M_t._M_impl._0_8_,
                          (ulong)((long)&(bindingPoints._M_t._M_impl.super__Rb_tree_header._M_header
                                         ._M_parent)->_M_color + 1));
        }
        bVar4 = false;
      }
      (*this_00->_vptr_LayoutBindingProgram[1])();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
      std::ios_base::~ios_base
                ((ios_base *)
                 &s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
                  field_0x70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)decl._M_dataplus._M_p != &decl.field_2) {
        operator_delete(decl._M_dataplus._M_p,decl.field_2._M_allocated_capacity + 1);
      }
      __return_storage_ptr__ = local_470;
      if (!bVar4) break;
      puVar8 = local_408 + 1;
      bVar15 = puVar8 < bindings.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish;
    } while (bVar15);
  }
  if (!bVar15) {
    puVar3 = &s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
    s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = 0;
    s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._16_1_ = 0;
    __return_storage_ptr__->m_passed = local_4ca;
    __return_storage_ptr__->m_notRunForThisContext = false;
    (__return_storage_ptr__->m_reason)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_reason).field_2;
    s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)puVar3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_reason,puVar3,puVar3);
    if (s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
        != (_func_int **)puVar3) {
      operator_delete(s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
                      _vptr_basic_ostream,
                      CONCAT71(s.super_ostringstream.
                               super_basic_ostream<char,_std::char_traits<char>_>._17_7_,
                               s.super_ostringstream.
                               super_basic_ostream<char,_std::char_traits<char>_>._16_1_) + 1);
    }
  }
  if (bindings.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(bindings.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)bindings.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)bindings.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

LayoutBindingTestResult LayoutBindingBaseCase::binding_array_implicit(void)
{
	bool passed = true;

	std::vector<int> bindings = makeSparseRange(maxBindings(), 0);
	for (std::vector<int>::iterator it = bindings.begin(); it < bindings.end(); it++)
	{
		int baseBindingPoint = *it;
		int arraySize		 = std::min(maxBindings() - baseBindingPoint, 4);

		String decl =
			buildUniformDecl(String(getTestParameters().keyword), buildLayout(baseBindingPoint),
							 String(getTestParameters().uniform_type), buildBlockName(getDefaultUniformName()),
							 buildBlock(getDefaultUniformName()), getDefaultUniformName(), buildArray(arraySize));
		setTemplateParam("UNIFORM_DECL", decl);

		StringStream s;
		for (int idx = 0; idx < arraySize; idx++)
		{
			s << (idx ? " + " : "") << buildAccess(buildArrayAccess(0, idx));
		}
		s << ";\n";
		setTemplateParam("UNIFORM_ACCESS", s.str());
		updateTemplate();

		LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
		passed &= program->compiledAndLinked();
		if (!passed)
		{
			return LayoutBindingTestResult(passed, program->getErrorLog());
		}
		StringVector list;
		for (int idx = 0; idx < arraySize; idx++)
		{
			std::ostringstream texUnitStr;
			texUnitStr << getDefaultUniformName();
			const String& u = buildBlockName(getDefaultUniformName());
			if (!u.empty())
				texUnitStr << "_block";
			texUnitStr << buildArray(idx);
			list.push_back(texUnitStr.str());
		}

		StringIntMap bindingPoints = program->getBindingPoints(list);
		for (int idx = 0; idx < arraySize; idx++)
		{
			passed &= ((baseBindingPoint + idx) == bindingPoints[list[idx]]);
			if (!passed)
			{
				return LayoutBindingTestResult(passed, generateLog(String("binding point did not match default"),
																   bindingPoints[list[idx]], (baseBindingPoint + idx)));
			}
		}
	}
	return LayoutBindingTestResult(passed, String());
}